

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall HEkkPrimal::basicFeasibilityChangeUpdateDual(HEkkPrimal *this)

{
  long lVar1;
  HEkk *pHVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  bool bVar6;
  undefined7 in_register_00000001;
  int iVar7;
  long lVar8;
  int iVar9;
  HighsInt to_entry;
  int local_24;
  
  local_24 = (int)((uint7)in_register_00000001 >> 0x18);
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x4a,0);
  pHVar2 = this->ekk_instance_;
  basicFeasibilityChangeBtran(this);
  basicFeasibilityChangePrice(this);
  bVar6 = HSimplexNla::sparseLoopStyle
                    (&this->ekk_instance_->simplex_nla_,(this->row_basic_feasibility_change).count,
                     this->num_col,&local_24);
  if (0 < (long)local_24) {
    piVar3 = (this->row_basic_feasibility_change).index.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->row_basic_feasibility_change).array.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5 = (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      if (bVar6) {
        iVar7 = piVar3[lVar8];
      }
      else {
        iVar7 = (int)lVar8;
      }
      pdVar5[iVar7] = pdVar5[iVar7] - pdVar4[iVar7];
      lVar8 = lVar8 + 1;
    } while (local_24 != lVar8);
  }
  bVar6 = HSimplexNla::sparseLoopStyle
                    (&this->ekk_instance_->simplex_nla_,(this->col_basic_feasibility_change).count,
                     this->num_row,&local_24);
  if (0 < (long)local_24) {
    piVar3 = (this->col_basic_feasibility_change).index.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->col_basic_feasibility_change).array.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar7 = this->num_col;
    pdVar5 = (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      if (bVar6) {
        iVar9 = piVar3[lVar8];
      }
      else {
        iVar9 = (int)lVar8;
      }
      lVar1 = (long)iVar7 + (long)iVar9;
      pdVar5[lVar1] = pdVar5[lVar1] - pdVar4[iVar9];
      lVar8 = lVar8 + 1;
    } while (local_24 != lVar8);
  }
  HEkk::invalidateDualInfeasibilityRecord(this->ekk_instance_);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x4a,0);
  return;
}

Assistant:

void HEkkPrimal::basicFeasibilityChangeUpdateDual() {
  analysis->simplexTimerStart(UpdateDualBasicFeasibilityChangeClock);
  HighsSimplexInfo& info = ekk_instance_.info_;
  // For basic logicals, the change in the basic cost will be a
  // component in col_basic_feasibility_change. This will lead to it being
  // subtracted from workDual in the loop below over the
  // nonzeros in col_basic_feasibility_change, so add it in now. For basic
  // structurals, there will be no corresponding component in
  // row_basic_feasibility_change, since only the nonbasic components are
  // computed (avoided using row pricing, and basic components
  // zeroed after column pricing). Hence there will be no
  // subtraction in the loop below over the nonzeros in
  // row_basic_feasibility_change. Hence, only add in the basic cost change
  // for logicals.
  //
  // Assumes that row_basic_feasibility_change has been set up in
  // phase1UpdatePrimal()

  basicFeasibilityChangeBtran();
  basicFeasibilityChangePrice();
  HighsInt to_entry;
  const bool use_row_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      row_basic_feasibility_change.count, num_col, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iCol =
        use_row_indices ? row_basic_feasibility_change.index[iEntry] : iEntry;
    info.workDual_[iCol] -= row_basic_feasibility_change.array[iCol];
  }
  const bool use_col_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      col_basic_feasibility_change.count, num_row, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow =
        use_col_indices ? col_basic_feasibility_change.index[iEntry] : iEntry;
    HighsInt iCol = num_col + iRow;
    info.workDual_[iCol] -= col_basic_feasibility_change.array[iRow];
  }
  ekk_instance_.invalidateDualInfeasibilityRecord();
  analysis->simplexTimerStop(UpdateDualBasicFeasibilityChangeClock);
}